

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::set_val_tag(Tree *this,size_t node,csubstr tag)

{
  code *pcVar1;
  bool bVar2;
  NodeData *pNVar3;
  
  pNVar3 = _p(this,node);
  if (((pNVar3->m_type).type & VAL) == NOTYPE) {
    pNVar3 = _p(this,node);
    if (((pNVar3->m_type).type & (STREAM|MAP)) == NOTYPE) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar2 = is_debugger_attached();
        if (bVar2) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
      }
      to_csubstr(
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                );
      (*(code *)PTR_error_impl_00234578)
                ("check failed: has_val(node) || is_container(node)",0x31,
                 (anonymous_namespace)::s_default_callbacks);
    }
  }
  pNVar3 = _p(this,node);
  (pNVar3->m_val).tag.str = tag.str;
  (pNVar3->m_val).tag.len = tag.len;
  _add_flags(this,node,VALTAG);
  return;
}

Assistant:

void set_val_tag(size_t node, csubstr tag) { RYML_ASSERT(has_val(node) || is_container(node)); _p(node)->m_val.tag = tag; _add_flags(node, VALTAG); }